

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

OPJ_BOOL opj_t1_encode_cblks(opj_t1_t *t1,opj_tcd_tile_t *tile,opj_tcp_t *tcp,OPJ_FLOAT64 *mct_norms
                            ,OPJ_UINT32 mct_numcomps)

{
  uint uVar1;
  uint uVar2;
  opj_tccp_t *poVar3;
  opj_tcd_resolution_t *poVar4;
  opj_tcd_precinct_t *poVar5;
  uint uVar6;
  OPJ_BOOL OVar7;
  OPJ_INT32 OVar8;
  opj_tcd_tilecomp_t *poVar9;
  opj_tcd_band_t *band_00;
  opj_tcd_cblk_enc_t *cblk_00;
  OPJ_INT32 *pOVar10;
  double dVar11;
  OPJ_INT32 tmp;
  OPJ_UINT32 *tiledp_u;
  opj_tcd_resolution_t *pres_1;
  opj_tcd_resolution_t *pres;
  OPJ_INT32 y;
  OPJ_INT32 x;
  OPJ_SIZE_T tileIndex;
  uint local_b0;
  OPJ_UINT32 tileLineAdvance;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_UINT32 cblk_h;
  OPJ_UINT32 cblk_w;
  OPJ_INT32 *tiledp;
  opj_tcd_cblk_enc_t *cblk;
  opj_tcd_precinct_t *prc;
  OPJ_INT32 bandconst;
  opj_tcd_band_t *band;
  opj_tcd_resolution_t *res;
  OPJ_UINT32 tile_w;
  opj_tccp_t *tccp;
  opj_tcd_tilecomp_t *tilec;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 precno;
  OPJ_UINT32 bandno;
  OPJ_UINT32 resno;
  OPJ_UINT32 compno;
  OPJ_UINT32 mct_numcomps_local;
  OPJ_FLOAT64 *mct_norms_local;
  opj_tcp_t *tcp_local;
  opj_tcd_tile_t *tile_local;
  opj_t1_t *t1_local;
  
  tile->distotile = 0.0;
  bandno = 0;
  do {
    if (tile->numcomps <= bandno) {
      return 1;
    }
    poVar9 = tile->comps + bandno;
    poVar3 = tcp->tccps;
    uVar6 = poVar9->x1 - poVar9->x0;
    for (precno = 0; precno < poVar9->numresolutions; precno = precno + 1) {
      poVar4 = poVar9->resolutions;
      for (cblkno = 0; cblkno < poVar4[precno].numbands; cblkno = cblkno + 1) {
        band_00 = poVar4[precno].bands + cblkno;
        OVar7 = opj_tcd_is_band_empty(band_00);
        if (OVar7 == 0) {
          dVar11 = floor((double)((float)band_00->stepsize * 8192.0));
          for (tilec._4_4_ = 0; tilec._4_4_ < poVar4[precno].pw * poVar4[precno].ph;
              tilec._4_4_ = tilec._4_4_ + 1) {
            poVar5 = band_00->precincts;
            for (tilec._0_4_ = 0; (uint)tilec < poVar5[tilec._4_4_].cw * poVar5[tilec._4_4_].ch;
                tilec._0_4_ = (uint)tilec + 1) {
              cblk_00 = poVar5[tilec._4_4_].cblks.enc + (uint)tilec;
              _y = 0;
              pres._4_4_ = cblk_00->x0 - band_00->x0;
              pres._0_4_ = cblk_00->y0 - band_00->y0;
              if ((band_00->bandno & 1) != 0) {
                pres._4_4_ = (poVar9->resolutions[precno - 1].x1 -
                             poVar9->resolutions[precno - 1].x0) + pres._4_4_;
              }
              if ((band_00->bandno & 2) != 0) {
                pres._0_4_ = (poVar9->resolutions[precno - 1].y1 -
                             poVar9->resolutions[precno - 1].y0) + (int)pres;
              }
              OVar7 = opj_t1_allocate_buffers
                                (t1,cblk_00->x1 - cblk_00->x0,cblk_00->y1 - cblk_00->y0);
              if (OVar7 == 0) {
                return 0;
              }
              uVar1 = t1->w;
              uVar2 = t1->h;
              pOVar10 = poVar9->data + (long)(int)pres * (ulong)uVar6 + (long)pres._4_4_;
              t1->data = pOVar10;
              t1->data_stride = uVar6;
              if (poVar3[bandno].qmfbid == 1) {
                for (local_b0 = 0; local_b0 < uVar2; local_b0 = local_b0 + 1) {
                  for (tileLineAdvance = 0; tileLineAdvance < uVar1;
                      tileLineAdvance = tileLineAdvance + 1) {
                    pOVar10[_y] = pOVar10[_y] << 6;
                    _y = _y + 1;
                  }
                  _y = (ulong)(uVar6 - uVar1) + _y;
                }
              }
              else {
                for (local_b0 = 0; local_b0 < uVar2; local_b0 = local_b0 + 1) {
                  for (tileLineAdvance = 0; tileLineAdvance < uVar1;
                      tileLineAdvance = tileLineAdvance + 1) {
                    OVar8 = opj_int_fix_mul_t1(pOVar10[_y],
                                               (OPJ_INT32)(0x4000000 / (long)(int)dVar11));
                    pOVar10[_y] = OVar8;
                    _y = _y + 1;
                  }
                  _y = (ulong)(uVar6 - uVar1) + _y;
                }
              }
              opj_t1_encode_cblk(t1,cblk_00,band_00->bandno,bandno,
                                 (poVar9->numresolutions - 1) - precno,poVar3[bandno].qmfbid,
                                 (OPJ_FLOAT64)(double)(float)band_00->stepsize,
                                 poVar3[bandno].cblksty,tile->numcomps,tile,mct_norms,mct_numcomps);
            }
          }
        }
      }
    }
    bandno = bandno + 1;
  } while( true );
}

Assistant:

OPJ_BOOL opj_t1_encode_cblks(opj_t1_t *t1,
                             opj_tcd_tile_t *tile,
                             opj_tcp_t *tcp,
                             const OPJ_FLOAT64 * mct_norms,
                             OPJ_UINT32 mct_numcomps
                            )
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;

    tile->distotile = 0;        /* fixed_quality */

    for (compno = 0; compno < tile->numcomps; ++compno) {
        opj_tcd_tilecomp_t* tilec = &tile->comps[compno];
        opj_tccp_t* tccp = &tcp->tccps[compno];
        OPJ_UINT32 tile_w = (OPJ_UINT32)(tilec->x1 - tilec->x0);

        for (resno = 0; resno < tilec->numresolutions; ++resno) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; ++bandno) {
                opj_tcd_band_t* OPJ_RESTRICT band = &res->bands[bandno];
                OPJ_INT32 bandconst;

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                bandconst = 8192 * 8192 / ((OPJ_INT32) floor(band->stepsize * 8192));
                for (precno = 0; precno < res->pw * res->ph; ++precno) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; ++cblkno) {
                        opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
                        OPJ_INT32* OPJ_RESTRICT tiledp;
                        OPJ_UINT32 cblk_w;
                        OPJ_UINT32 cblk_h;
                        OPJ_UINT32 i, j, tileLineAdvance;
                        OPJ_SIZE_T tileIndex = 0;

                        OPJ_INT32 x = cblk->x0 - band->x0;
                        OPJ_INT32 y = cblk->y0 - band->y0;
                        if (band->bandno & 1) {
                            opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
                            x += pres->x1 - pres->x0;
                        }
                        if (band->bandno & 2) {
                            opj_tcd_resolution_t *pres = &tilec->resolutions[resno - 1];
                            y += pres->y1 - pres->y0;
                        }

                        if (!opj_t1_allocate_buffers(
                                    t1,
                                    (OPJ_UINT32)(cblk->x1 - cblk->x0),
                                    (OPJ_UINT32)(cblk->y1 - cblk->y0))) {
                            return OPJ_FALSE;
                        }

                        cblk_w = t1->w;
                        cblk_h = t1->h;
                        tileLineAdvance = tile_w - cblk_w;

                        tiledp = &tilec->data[(OPJ_SIZE_T)y * tile_w + (OPJ_SIZE_T)x];
                        t1->data = tiledp;
                        t1->data_stride = tile_w;
                        if (tccp->qmfbid == 1) {
                            /* Do multiplication on unsigned type, even if the
                             * underlying type is signed, to avoid potential
                             * int overflow on large value (the output will be
                             * incorrect in such situation, but whatever...)
                             * This assumes complement-to-2 signed integer
                             * representation
                             * Fixes https://github.com/uclouvain/openjpeg/issues/1053
                             */
                            OPJ_UINT32* OPJ_RESTRICT tiledp_u = (OPJ_UINT32*) tiledp;
                            for (j = 0; j < cblk_h; ++j) {
                                for (i = 0; i < cblk_w; ++i) {
                                    tiledp_u[tileIndex] <<= T1_NMSEDEC_FRACBITS;
                                    tileIndex++;
                                }
                                tileIndex += tileLineAdvance;
                            }
                        } else {        /* if (tccp->qmfbid == 0) */
                            for (j = 0; j < cblk_h; ++j) {
                                for (i = 0; i < cblk_w; ++i) {
                                    OPJ_INT32 tmp = tiledp[tileIndex];
                                    tiledp[tileIndex] =
                                        opj_int_fix_mul_t1(
                                            tmp,
                                            bandconst);
                                    tileIndex++;
                                }
                                tileIndex += tileLineAdvance;
                            }
                        }

                        opj_t1_encode_cblk(
                            t1,
                            cblk,
                            band->bandno,
                            compno,
                            tilec->numresolutions - 1 - resno,
                            tccp->qmfbid,
                            band->stepsize,
                            tccp->cblksty,
                            tile->numcomps,
                            tile,
                            mct_norms,
                            mct_numcomps);

                    } /* cblkno */
                } /* precno */
            } /* bandno */
        } /* resno  */
    } /* compno  */
    return OPJ_TRUE;
}